

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest_CustomOption_Test::TestBody
          (AllowUnknownDependenciesTest_CustomOption_Test *this)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  uint uVar3;
  Message *in_RCX;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  Metadata MVar5;
  string_view input;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  FileDescriptorProto option_proto;
  AssertHelper local_170;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  undefined1 local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_130;
  pointer local_128;
  AssertHelper local_118;
  FileDescriptorProto local_110;
  
  FileDescriptorProto::FileDescriptorProto(&local_110,(Arena *)0x0);
  input._M_str = (char *)&local_110;
  input._M_len = (size_t)
                 "name: \"unknown_custom_options.proto\" dependency: \"google/protobuf/descriptor.proto\" extension {   extendee: \"google.protobuf.FileOptions\"   name: \"some_option\"   number: 123456   label: LABEL_OPTIONAL   type: TYPE_INT32 } options {   uninterpreted_option {     name {       name_part: \"some_option\"       is_extension: true     }     positive_int_value: 1234   }   uninterpreted_option {     name {       name_part: \"unknown_option\"       is_extension: true     }     positive_int_value: 1234   }   uninterpreted_option {     name {       name_part: \"optimize_for\"       is_extension: false     }     identifier_value: \"SPEED\"   } }"
  ;
  bVar1 = TextFormat::ParseFromString((TextFormat *)0x278,input,in_RCX);
  local_138[0] = bVar1;
  pbStack_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_138,
               (AssertionResult *)
               "TextFormat::ParseFromString( \"name: \\\"unknown_custom_options.proto\\\" \" \"dependency: \\\"google/protobuf/descriptor.proto\\\" \" \"extension { \" \"  extendee: \\\"google.protobuf.FileOptions\\\" \" \"  name: \\\"some_option\\\" \" \"  number: 123456 \" \"  label: LABEL_OPTIONAL \" \"  type: TYPE_INT32 \" \"} \" \"options { \" \"  uninterpreted_option { \" \"    name { \" \"      name_part: \\\"some_option\\\" \" \"      is_extension: true \" \"    } \" \"    positive_int_value: 1234 \" \"  } \" \"  uninterpreted_option { \" \"    name { \" \"      name_part: \\\"unknown_option\\\" \" \"      is_extension: true \" \"    } \" \"    positive_int_value: 1234 \" \"  } \" \"  uninterpreted_option { \" \"    name { \" \"      name_part: \\\"optimize_for\\\" \" \"      is_extension: false \" \"    } \" \"    identifier_value: \\\"SPEED\\\" \" \"  } \" \"}\", &option_proto)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xeb1,(char *)CONCAT71(local_158._1_7_,local_158[0]));
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_158._1_7_,local_158[0]) != &local_148) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_158._1_7_,local_158[0]),local_148._M_allocated_capacity + 1)
      ;
    }
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
    if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_130,pbStack_130);
    }
    if (!bVar1) goto LAB_0058ec2b;
  }
  pFVar2 = AllowUnknownDependenciesTest::BuildFile
                     (&this->super_AllowUnknownDependenciesTest,&local_110);
  local_138[0] = pFVar2 != (FileDescriptor *)0x0;
  pbStack_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pFVar2 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_138,(AssertionResult *)0x10faf95,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xeb4,(char *)CONCAT71(local_158._1_7_,local_158[0]));
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_158._1_7_,local_158[0]) != &local_148) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_158._1_7_,local_158[0]),local_148._M_allocated_capacity + 1)
      ;
    }
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
    if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_130,pbStack_130);
    }
    goto LAB_0058ec2b;
  }
  local_138 = (undefined1  [8])0x0;
  pbStack_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_128 = (pointer)0x0;
  MVar5 = FileOptions::GetMetadata((FileOptions *)_FileOptions_default_instance_);
  Reflection::ListFields
            (MVar5.reflection,&pFVar2->options_->super_Message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_138);
  local_170.data_._0_4_ = 2;
  local_168._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)pbStack_130 - (long)local_138 >> 3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_158,"2","fields.size()",(int *)&local_170,(unsigned_long *)&local_168
            );
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (local_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xeba,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
LAB_0058ebe6:
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  else {
    if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_150,local_150);
    }
    uVar3 = (pFVar2->options_->field_0)._impl_._has_bits_.has_bits_[0] & 0x40000;
    local_168._M_head_impl._0_1_ = (char)(uVar3 >> 0x12);
    local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (uVar3 == 0) {
      testing::Message::Message((Message *)&local_170);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_158,(internal *)&local_168,
                 (AssertionResult *)"file->options().has_optimize_for()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xebb,(char *)CONCAT71(local_158._1_7_,local_158[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_158._1_7_,local_158[0]) != &local_148) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_158._1_7_,local_158[0]),
                        local_148._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 8))();
      }
    }
    if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_160,local_160);
    }
    local_168._M_head_impl._0_4_ = 2;
    local_170.data_._0_4_ = *(undefined4 *)((long)&pFVar2->options_->field_0 + 0x28);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_158,"2","file->options().uninterpreted_option_size()",
               (int *)&local_168,(int *)&local_170);
    if (local_158[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_168);
      if (local_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar4 = (local_150->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xebc,pcVar4);
      testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
      goto LAB_0058ebe6;
    }
  }
  if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,local_150);
  }
  if (local_138 != (undefined1  [8])0x0) {
    operator_delete((void *)local_138,(long)local_128 - (long)local_138);
  }
LAB_0058ec2b:
  FileDescriptorProto::~FileDescriptorProto(&local_110);
  return;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest, CustomOption) {
  // Test that we can use a custom option without having parsed
  // descriptor.proto.

  FileDescriptorProto option_proto;

  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: \"unknown_custom_options.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { "
      "  extendee: \"google.protobuf.FileOptions\" "
      "  name: \"some_option\" "
      "  number: 123456 "
      "  label: LABEL_OPTIONAL "
      "  type: TYPE_INT32 "
      "} "
      "options { "
      "  uninterpreted_option { "
      "    name { "
      "      name_part: \"some_option\" "
      "      is_extension: true "
      "    } "
      "    positive_int_value: 1234 "
      "  } "
      "  uninterpreted_option { "
      "    name { "
      "      name_part: \"unknown_option\" "
      "      is_extension: true "
      "    } "
      "    positive_int_value: 1234 "
      "  } "
      "  uninterpreted_option { "
      "    name { "
      "      name_part: \"optimize_for\" "
      "      is_extension: false "
      "    } "
      "    identifier_value: \"SPEED\" "
      "  } "
      "}",
      &option_proto));

  const FileDescriptor* file = BuildFile(option_proto);
  ASSERT_TRUE(file != nullptr);

  // Verify that no extension options were set, but they were left as
  // uninterpreted_options.
  std::vector<const FieldDescriptor*> fields;
  file->options().GetReflection()->ListFields(file->options(), &fields);
  ASSERT_EQ(2, fields.size());
  EXPECT_TRUE(file->options().has_optimize_for());
  EXPECT_EQ(2, file->options().uninterpreted_option_size());
}